

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_setbyhandle(HSQUIRRELVM v,SQInteger idx,HSQMEMBERHANDLE *handle)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQObjectPtr *self;
  SQObjectPtr *pSVar5;
  SQRESULT SVar6;
  SQRESULT SVar7;
  SQObjectPtr *val;
  SQObjectPtr *local_30;
  
  if (idx < 0) {
    self = SQVM::GetUp(v,idx);
  }
  else {
    self = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar7 = -1;
  pSVar5 = SQVM::GetUp(v,-1);
  local_30 = (SQObjectPtr *)0x0;
  SVar6 = _getmemberbyhandle(v,self,handle,&local_30);
  if (-1 < SVar6) {
    SVar2 = (local_30->super_SQObject)._type;
    pSVar4 = (local_30->super_SQObject)._unVal.pTable;
    (local_30->super_SQObject)._unVal = (pSVar5->super_SQObject)._unVal;
    SVar3 = (pSVar5->super_SQObject)._type;
    (local_30->super_SQObject)._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(((local_30->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    SQVM::Pop(v);
    SVar7 = 0;
  }
  return SVar7;
}

Assistant:

SQRESULT sq_setbyhandle(HSQUIRRELVM v,SQInteger idx,const HSQMEMBERHANDLE *handle)
{
    SQObjectPtr &self = stack_get(v,idx);
    SQObjectPtr &newval = stack_get(v,-1);
    SQObjectPtr *val = NULL;
    if(SQ_FAILED(_getmemberbyhandle(v,self,handle,val))) {
        return SQ_ERROR;
    }
    *val = newval;
    v->Pop();
    return SQ_OK;
}